

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

sexp_conflict
sexp_bit_xor(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  sexp_conflict psVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  sexp_sint_t i;
  sexp_sint_t tmplen;
  sexp_sint_t len;
  bool local_89;
  ulong local_88;
  sexp_conflict in_stack_ffffffffffffff80;
  sexp_conflict in_stack_ffffffffffffff88;
  sexp_conflict local_60;
  undefined1 local_58 [40];
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 uVar8;
  
  local_58._16_8_ = 0x43e;
  memset(local_58,0,0x10);
  local_60 = (sexp_conflict)&DAT_0000043e;
  memset(&stack0xffffffffffffff90,0,0x10);
  if ((in_RCX & 1) == 1) {
    if ((in_R8 & 1) == 1) {
      auVar1._8_8_ = (long)in_RCX >> 0x3f;
      auVar1._0_8_ = in_RCX & 0xfffffffffffffffe;
      auVar2._8_8_ = (long)in_R8 >> 0x3f;
      auVar2._0_8_ = in_R8 & 0xfffffffffffffffe;
      local_58._16_8_ = (SUB168(auVar1 / SEXT816(2),0) ^ SUB168(auVar2 / SEXT816(2),0)) << 1 | 1;
    }
    else if (((in_R8 & 3) == 0) && (((sexp)in_R8)->tag == 0xc)) {
      local_58._16_8_ =
           sexp_bit_xor((sexp_conflict)in_RSI,(sexp_conflict)in_RDX,in_RCX,(sexp_conflict)in_R8,
                        (sexp_conflict)in_stack_ffffffffffffffd0);
    }
    else {
      local_58._16_8_ = sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xc)) {
    local_58._0_8_ = local_58 + 0x10;
    local_58._8_8_ = *(undefined8 *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = local_58;
    psVar7 = (sexp_conflict)&local_60;
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff90;
    if (((in_R8 & 1) == 1) &&
       (auVar3._8_8_ = (long)in_R8 >> 0x3f, auVar3._0_8_ = in_R8 & 0xfffffffffffffffe,
       -1 < SUB168(auVar3 / SEXT816(2),0))) {
      local_58._16_8_ = sexp_copy_bignum(in_RDI,0,in_RCX);
      if ((((sexp_conflict)local_58._16_8_)->value).flonum_bits[0] < '\0') {
        sexp_set_twos_complement((sexp_conflict)local_58._16_8_);
      }
      auVar4._8_8_ = (long)in_R8 >> 0x3f;
      auVar4._0_8_ = in_R8 & 0xfffffffffffffffe;
      (((anon_union_24768_35_b8e82fc1_for_value *)(local_58._16_8_ + 8))->string).length =
           SUB168(auVar4 / SEXT816(2),0) ^
           (((anon_union_24768_35_b8e82fc1_for_value *)(local_58._16_8_ + 8))->string).length;
      if (((anon_union_24768_35_b8e82fc1_for_value *)(local_58._16_8_ + 8))->flonum_bits[0] < '\0')
      {
        sexp_set_twos_complement((sexp_conflict)local_58._16_8_);
      }
    }
    else if ((((in_R8 & 3) == 0) && (((sexp)in_R8)->tag == 0xc)) || ((in_R8 & 1) == 1)) {
      if (((in_R8 & 1) == 1) ||
         ((((sexp)in_R8)->value).type.cpl <= (((sexp)in_RCX)->value).type.cpl)) {
        local_58._16_8_ = sexp_copy_bignum(in_RDI,0,in_RCX);
        if ((in_R8 & 1) == 1) {
          local_60 = sexp_fixnum_to_twos_complement
                               (psVar7,in_stack_ffffffffffffff88,
                                (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        }
        else {
          local_60 = sexp_twos_complement(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        }
        uVar8 = (local_60->value).fileno.fd;
      }
      else {
        local_58._16_8_ = sexp_copy_bignum(in_RDI,0,in_R8);
        local_60 = sexp_twos_complement(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        uVar8 = (local_60->value).fileno.fd;
      }
      if (((anon_union_24768_35_b8e82fc1_for_value *)(local_58._16_8_ + 8))->flonum_bits[0] < '\0')
      {
        sexp_set_twos_complement((sexp_conflict)local_58._16_8_);
      }
      local_58._32_8_ = (local_60->value).fileno.fd;
      for (local_58._24_8_ = (sexp)0x0; (long)local_58._24_8_ < (long)uVar8;
          local_58._24_8_ = (long)(sexp_tag_t *)local_58._24_8_ + 1) {
        if ((long)local_58._24_8_ < (long)local_58._32_8_) {
          local_88 = *(ulong *)((long)&local_60->value + local_58._24_8_ * 8 + 0x10);
        }
        else {
          iVar6 = 0;
          if ((local_60->value).flonum_bits[0] < '\0') {
            iVar6 = -1;
          }
          local_88 = (ulong)iVar6;
        }
        *(ulong *)((long)(local_58._16_8_ + 8) + local_58._24_8_ * 8 + 0x10) =
             local_88 ^ *(ulong *)((long)(local_58._16_8_ + 8) + local_58._24_8_ * 8 + 0x10);
      }
      local_89 = true;
      if ((in_R8 & 1) != 1) {
        local_89 = (((sexp)in_R8)->value).flonum_bits[0] < '\0';
      }
      if ((((sexp)in_RCX)->value).flonum_bits[0] < '\0' != local_89) {
        sexp_set_twos_complement((sexp_conflict)local_58._16_8_);
      }
      if (((in_R8 & 1) == 1) || ((((sexp)in_R8)->value).flonum_bits[0] < '\0')) {
        if (((local_58._16_8_ & 3) == 0) && (*(sexp_tag_t *)local_58._16_8_ == 0xc)) {
          ((anon_union_24768_35_b8e82fc1_for_value *)(local_58._16_8_ + 8))->flonum_bits[0] =
               -((anon_union_24768_35_b8e82fc1_for_value *)(local_58._16_8_ + 8))->flonum_bits[0];
        }
        else if ((local_58._16_8_ & 1) == 1) {
          auVar5._8_8_ = (long)local_58._16_8_ >> 0x3f;
          auVar5._0_8_ = local_58._16_8_ & 0xfffffffffffffffe;
          local_58._16_8_ = SUB168(auVar5 / SEXT816(2),0) * -2 | 1;
        }
      }
    }
    else {
      local_58._16_8_ = sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
    *(undefined8 *)(in_RDI + 0x6080) = local_58._8_8_;
  }
  else {
    local_58._16_8_ = sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
  }
  psVar7 = (sexp_conflict)sexp_bignum_normalize(local_58._16_8_);
  return psVar7;
}

Assistant:

sexp sexp_bit_xor (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp y) {
#if SEXP_USE_BIGNUMS
  sexp_sint_t len, tmplen, i;
#endif
  sexp_gc_var2(res, tmp);
  if (sexp_fixnump(x)) {
    if (sexp_fixnump(y))
      res = sexp_make_fixnum(sexp_unbox_fixnum(x) ^ sexp_unbox_fixnum(y));
#if SEXP_USE_BIGNUMS
    else if (sexp_bignump(y))
      res = sexp_bit_xor(ctx, self, n, y, x);
#endif
    else
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y);
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(x)) {
    sexp_gc_preserve2(ctx, res, tmp);
    if (sexp_fixnump(y) && sexp_unbox_fixnum(y) >= 0) {
      res = sexp_copy_bignum(ctx, NULL, x, 0);
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
      sexp_bignum_data(res)[0] ^= sexp_unbox_fixnum(y);
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
    } else if (sexp_bignump(y) || sexp_fixnump(y)) {
      if (sexp_fixnump(y) || sexp_bignum_length(x) >= sexp_bignum_length(y)) {
        res = sexp_copy_bignum(ctx, NULL, x, 0);
        tmp = sexp_fixnump(y) ? sexp_fixnum_to_twos_complement(ctx, y, sexp_bignum_length(x)) : sexp_twos_complement(ctx, y);
        len = sexp_bignum_length(tmp);
      } else {
        res = sexp_copy_bignum(ctx, NULL, y, 0);
        tmp = sexp_twos_complement(ctx, y);
        len = sexp_bignum_length(tmp);
      }
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
      tmplen = sexp_bignum_length(tmp);
      for (i=0; i<len; i++)
        sexp_bignum_data(res)[i] ^= (i<tmplen ? sexp_bignum_data(tmp)[i] : sexp_bignum_sign(tmp) < 0 ? -1 : 0);
      if ((sexp_bignum_sign(x) < 0) ^ (sexp_fixnump(y) || sexp_bignum_sign(y) < 0))
        sexp_set_twos_complement(res);
      if (sexp_fixnump(y) || sexp_bignum_sign(y) < 0) {
        sexp_negate_exact(res);
      }
    } else {
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y);
    }
    sexp_gc_release2(ctx);
#endif
  } else {
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
  return sexp_bignum_normalize(res);
}